

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eve.cpp
# Opt level: O2

void eve::readevents(vector<int,_std::allocator<int>_> *events)

{
  FILE *__stream;
  size_t sVar1;
  int eventid;
  
  __stream = fopen("input/events.bin","rb");
  if (__stream != (FILE *)0x0) {
    while( true ) {
      sVar1 = fread(&eventid,4,1,__stream);
      if (sVar1 != 1) break;
      std::vector<int,_std::allocator<int>_>::push_back(events,&eventid);
    }
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"FATAL: %s: %s: cannot open %s\n",progname,"readevents","input/events.bin");
  exit(1);
}

Assistant:

void readevents(std::vector<int> &events) {
        FILE *fin = fopen(EVENTS_FILE, "rb");
        if (fin == NULL) {
            fprintf(stderr, "FATAL: %s: %s: cannot open %s\n", progname, __func__,
                    EVENTS_FILE);
            exit(EXIT_FAILURE);
        }
        int eventid;
        while (fread(&eventid, sizeof(eventid), 1, fin) == 1) {
            events.push_back(eventid);
        }
        fclose(fin);
    }